

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::ChNodeFEAxyzDDD
          (ChNodeFEAxyzDDD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir_u,
          ChVector<double> *initial_dir_v,ChVector<double> *initial_dir_w)

{
  double dVar1;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar5 [16];
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  undefined1 auVar6 [32];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x1d8);
  *(undefined ***)
   &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    field_0x18 = &PTR__ChLoadable_00b04a88;
  local_48.m_data[0] = initial_pos->m_data[0];
  local_48.m_data[1] = initial_pos->m_data[1];
  local_48.m_data[2] = initial_pos->m_data[2];
  local_68.m_data[0] = initial_dir_u->m_data[0];
  local_68.m_data[1] = initial_dir_u->m_data[1];
  local_68.m_data[2] = initial_dir_u->m_data[2];
  local_88.m_data[0] = initial_dir_v->m_data[0];
  local_88.m_data[1] = initial_dir_v->m_data[1];
  local_88.m_data[2] = initial_dir_v->m_data[2];
  ChNodeFEAxyzDD::ChNodeFEAxyzDD
            (&this->super_ChNodeFEAxyzDD,&PTR_construction_vtable_32__00b2fab0,&local_48,&local_68,
             &local_88);
  (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
  _vptr_ChNodeFEAbase = (_func_int **)0xb2f650;
  *(undefined8 *)&this->field_0x1d8 = 0xb2f9f0;
  *(undefined8 *)
   &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    field_0x18 = 0xb2f850;
  (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
  super_ChVariableTupleCarrier_1vars<3>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x2e8);
  *(double *)&(this->super_ChNodeFEAxyzDD).field_0x190 = initial_dir_w->m_data[0];
  *(double *)&this->field_0x198 = initial_dir_w->m_data[1];
  auVar4 = _VNULL;
  auVar5._8_8_ = DAT_00b689a8;
  auVar5._0_8_ = DAT_00b689a8;
  auVar6._16_8_ = DAT_00b689a8;
  auVar6._0_16_ = auVar5;
  auVar6._24_8_ = DAT_00b689a8;
  auVar3 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar3 = vblendps_avx(auVar3,ZEXT832((ulong)initial_dir_w->m_data[2]),3);
  auVar3 = vblendps_avx(auVar3,auVar6,0xc0);
  *(undefined1 (*) [32])&this->field_0x1a0 = auVar3;
  *(undefined1 (*) [16])(this->DDD_dtdt).m_data = auVar4;
  dVar1 = (double)vmovlps_avx(auVar5);
  (this->DDD_dtdt).m_data[2] = dVar1;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzDD).field_0x188 = this_00;
  lVar2 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < lVar2) {
    if (lVar2 != 0) {
      memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data,0,lVar2 << 3);
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChNodeFEAxyzDDD::ChNodeFEAxyzDDD(ChVector<> initial_pos, ChVector<> initial_dir_u, ChVector<> initial_dir_v, ChVector<> initial_dir_w)
    : ChNodeFEAxyzDD(initial_pos, initial_dir_u, initial_dir_v), DDD(initial_dir_w), DDD_dt(VNULL), DDD_dtdt(VNULL) {
    variables_DDD = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_DDD->GetMassDiagonal().setZero();
}